

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

void __thiscall Mems::compare_by_x_m(Mems *this)

{
  std::
  __sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
            ((this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10e4cf);
  return;
}

Assistant:

void Mems::compare_by_x_m(){
  std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_x);
}